

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__horizontal_gather_3_channels_with_9_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float *pfVar9;
  float *pfVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  pfVar10 = horizontal_coefficients + 8;
  pfVar9 = output_buffer;
  do {
    pfVar1 = decode_buffer + (long)horizontal_contributors->n0 * 3;
    fVar13 = pfVar10[-8];
    fVar2 = pfVar10[-7];
    fVar3 = pfVar10[-6];
    fVar4 = pfVar10[-5];
    fVar5 = pfVar10[-4];
    fVar6 = pfVar10[-3];
    fVar7 = pfVar10[-2];
    fVar8 = pfVar10[-1];
    fVar14 = fVar7 * pfVar1[0x14] + fVar3 * pfVar1[8];
    fVar15 = fVar8 * pfVar1[0x15] + fVar4 * pfVar1[9];
    fVar12 = *pfVar10;
    fVar16 = pfVar1[0x1a] * fVar12 + pfVar1[0xe] * fVar5 + pfVar1[2] * fVar13;
    fVar17 = pfVar1[0x1b] * 0.0 + pfVar1[0xf] * fVar6 + pfVar1[3] * fVar2;
    fVar11 = fVar7 * pfVar1[0x12] + fVar3 * pfVar1[6] +
             pfVar1[0x18] * fVar12 + pfVar1[0xc] * fVar5 + *pfVar1 * fVar13 + fVar15 + fVar17;
    fVar12 = fVar7 * pfVar1[0x13] + fVar3 * pfVar1[7] +
             pfVar1[0x19] * fVar12 + pfVar1[0xd] * fVar5 + pfVar1[1] * fVar13 +
             fVar8 * pfVar1[0x16] + fVar4 * pfVar1[10] + fVar6 * pfVar1[0x10] + fVar2 * pfVar1[4];
    fVar13 = fVar14 + fVar16 +
             fVar8 * pfVar1[0x17] + fVar4 * pfVar1[0xb] + fVar6 * pfVar1[0x11] + fVar2 * pfVar1[5];
    pfVar1 = pfVar9 + 3;
    if (pfVar1 < output_buffer + output_sub_size * 3) {
      *pfVar9 = fVar11;
      pfVar9[1] = fVar12;
      pfVar9[2] = fVar13;
      pfVar9[3] = fVar15 + fVar17 + fVar14 + fVar16;
    }
    else {
      *(ulong *)pfVar9 = CONCAT44(fVar12,fVar11);
      pfVar9[2] = fVar13;
    }
    horizontal_contributors = horizontal_contributors + 1;
    pfVar10 = pfVar10 + coefficient_width;
    pfVar9 = pfVar1;
  } while (pfVar1 < output_buffer + output_sub_size * 3);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_9_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__4_coeff_continue_from_4(4);
    stbir__1_coeff_remnant(8);
    stbir__store_output();
  } while ( output < output_end );
}